

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

TValue * luaH_newkey(lua_State *L,Table *t,TValue *key)

{
  Node *pNVar1;
  int *piVar2;
  Node *pNVar3;
  Value VVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  int lg;
  int iVar7;
  Node *pNVar8;
  Node *pNVar9;
  Node *pNVar10;
  TValue *pTVar11;
  long lVar12;
  uint ttlg;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  uint ause;
  int iVar18;
  uint uVar19;
  uint uVar20;
  char *fmt;
  int iVar21;
  ulong uVar22;
  uint *nums;
  uint twotoi;
  ulong uVar23;
  int local_dc;
  TValue aux;
  lua_Integer k;
  
  if (key->tt_ == 3) {
    iVar18 = luaV_tointeger(key,&k,0);
    if (iVar18 == 0) {
      if (NAN((key->value_).n)) {
        fmt = "table index is NaN";
        goto LAB_0011fd0c;
      }
    }
    else {
      key = &aux;
      aux.value_.i = k;
      aux.tt_ = 0x13;
    }
  }
  else if (key->tt_ == 0) {
    fmt = "table index is nil";
LAB_0011fd0c:
    luaG_runerror(L,fmt);
  }
  pNVar8 = mainposition(t,key);
  pNVar3 = t->lastfree;
  if ((pNVar8->i_val).tt_ == 0) {
    if (pNVar3 == (Node *)0x0) goto LAB_0011fb2d;
  }
  else {
    if (pNVar3 == (Node *)0x0) {
LAB_0011fb2d:
      for (lVar16 = 0; lVar16 != 0x20; lVar16 = lVar16 + 1) {
        *(undefined4 *)((long)&k + lVar16 * 4) = 0;
      }
      lVar16 = 0;
      uVar13 = 1;
      iVar18 = 0;
      uVar14 = 1;
      while ((lVar16 != 0x20 &&
             ((uVar20 = t->sizearray, uVar19 = uVar13, uVar13 <= uVar20 ||
              (uVar19 = uVar20, uVar14 <= uVar20))))) {
        uVar20 = uVar19 + 1;
        if (uVar19 + 1 < uVar14) {
          uVar20 = uVar14;
        }
        iVar21 = 0;
        for (uVar14 = uVar14 - 1; uVar14 - uVar20 != -1; uVar14 = uVar14 + 1) {
          iVar21 = (iVar21 + 1) - (uint)(t->array[uVar14].tt_ == 0);
        }
        piVar2 = (int *)((long)&k + lVar16 * 4);
        *piVar2 = *piVar2 + iVar21;
        iVar18 = iVar18 + iVar21;
        lVar16 = lVar16 + 1;
        uVar13 = uVar13 * 2;
        uVar14 = uVar20;
      }
      uVar23 = 1;
      lVar16 = (long)(1 << (t->lsizenode & 0x1f));
      iVar21 = 0;
      nums = (uint *)&k;
      local_dc = 0;
      do {
        lVar17 = -lVar16;
        uVar15 = lVar16 << 5 | 0x10;
        do {
          uVar22 = uVar15;
          lVar17 = lVar17 + 1;
          if (lVar17 == 1) {
            iVar7 = countint(key,nums);
            uVar14 = 0;
            uVar13 = 0;
            uVar15 = 0;
            while( true ) {
              uVar20 = (uint)(uVar23 >> 1);
              if ((uint)(iVar7 + iVar21 + iVar18) <= uVar20) break;
              uVar14 = uVar14 + *nums;
              uVar22 = uVar15;
              uVar19 = uVar13;
              if (uVar20 < uVar14) {
                uVar22 = uVar23;
                uVar19 = uVar14;
              }
              if (*nums != 0) {
                uVar15 = uVar22;
                uVar13 = uVar19;
              }
              uVar23 = (ulong)(uint)((int)uVar23 * 2);
              nums = nums + 1;
            }
            luaH_resize(L,t,(uint)uVar15,((iVar18 + local_dc) - uVar13) + 1);
            pTVar11 = luaH_set(L,t,key);
            return pTVar11;
          }
          uVar15 = uVar22 - 0x20;
        } while (*(int *)((long)t->node + (uVar22 - 0x28)) == 0);
        iVar7 = countint((TValue *)((long)&t->node[-1].i_val.value_ + uVar22),nums);
        iVar21 = iVar21 + iVar7;
        local_dc = local_dc + 1;
        lVar16 = -lVar17;
      } while( true );
    }
    lVar16 = 0;
    do {
      lVar17 = lVar16;
      if ((Node *)((long)&(pNVar3->i_val).value_ + lVar17) <= t->node) goto LAB_0011fb2d;
      t->lastfree = (Node *)((long)&pNVar3[-1].i_val.value_ + lVar17);
      lVar16 = lVar17 + -0x20;
    } while (*(int *)((long)pNVar3 + lVar17 + -8) != 0);
    pNVar9 = mainposition(t,&(pNVar8->i_key).tvk);
    pNVar1 = (Node *)((long)&pNVar3[-1].i_val.value_ + lVar17);
    if (pNVar9 == pNVar8) {
      lVar12 = (long)(pNVar8->i_key).nk.next;
      if (lVar12 != 0) {
        *(int *)((long)&pNVar3[-1].i_key + lVar17 + 0xc) =
             (int)((ulong)((long)pNVar8 + ((lVar12 * 0x20 - (long)pNVar3) - lVar16)) >> 5);
      }
      (pNVar8->i_key).nk.next = (int)((ulong)((long)pNVar3 + (lVar16 - (long)pNVar8)) >> 5);
      pNVar8 = pNVar1;
    }
    else {
      do {
        pNVar10 = pNVar9;
        pNVar9 = pNVar10 + (pNVar10->i_key).nk.next;
      } while (pNVar10 + (pNVar10->i_key).nk.next != pNVar8);
      (pNVar10->i_key).nk.next = (int)((ulong)((long)pNVar3 + (lVar16 - (long)pNVar10)) >> 5);
      VVar4 = (pNVar8->i_val).value_;
      iVar18 = (pNVar8->i_val).tt_;
      uVar6 = *(undefined4 *)&(pNVar8->i_val).field_0xc;
      uVar5 = *(undefined8 *)((long)&pNVar8->i_key + 8);
      (pNVar1->i_key).nk.value_ = (pNVar8->i_key).nk.value_;
      *(undefined8 *)((long)&pNVar1->i_key + 8) = uVar5;
      (pNVar1->i_val).value_ = VVar4;
      (pNVar1->i_val).tt_ = iVar18;
      *(undefined4 *)&(pNVar1->i_val).field_0xc = uVar6;
      if ((pNVar8->i_key).nk.next != 0) {
        piVar2 = (int *)((long)&pNVar3[-1].i_key + lVar17 + 0xc);
        *piVar2 = *piVar2 + (int)((ulong)((long)pNVar8 + (-lVar16 - (long)pNVar3)) >> 5);
        (pNVar8->i_key).nk.next = 0;
      }
      (pNVar8->i_val).tt_ = 0;
    }
  }
  (pNVar8->i_key).nk.value_ = key->value_;
  uVar13 = key->tt_;
  (pNVar8->i_key).nk.tt_ = uVar13;
  if ((((uVar13 & 0x40) != 0) && ((t->marked & 4) != 0)) && ((((key->value_).gc)->marked & 3) != 0))
  {
    luaC_barrierback_(L,t);
  }
  return &pNVar8->i_val;
}

Assistant:

TValue *luaH_newkey (lua_State *L, Table *t, const TValue *key) {
  Node *mp;
  TValue aux;
  if (unlikely(ttisnil(key)))
    luaG_runerror(L, "table index is nil");
  else if (ttisfloat(key)) {
    lua_Number f = fltvalue(key);
    lua_Integer k;
    if (luaV_flttointeger(f, &k, F2Ieq)) {  /* does key fit in an integer? */
      setivalue(&aux, k);
      key = &aux;  /* insert it as an integer */
    }
    else if (unlikely(luai_numisnan(f)))
      luaG_runerror(L, "table index is NaN");
  }
  mp = mainpositionTV(t, key);
  if (!isempty(gval(mp)) || isdummy(t)) {  /* main position is taken? */
    Node *othern;
    Node *f = getfreepos(t);  /* get a free place */
    if (f == NULL) {  /* cannot find a free place? */
      rehash(L, t, key);  /* grow table */
      /* whatever called 'newkey' takes care of TM cache */
      return luaH_set(L, t, key);  /* insert key into grown table */
    }
    lua_assert(!isdummy(t));
    othern = mainposition(t, keytt(mp), &keyval(mp));
    if (othern != mp) {  /* is colliding node out of its main position? */
      /* yes; move colliding node into free position */
      while (othern + gnext(othern) != mp)  /* find previous */
        othern += gnext(othern);
      gnext(othern) = cast_int(f - othern);  /* rechain to point to 'f' */
      *f = *mp;  /* copy colliding node into free pos. (mp->next also goes) */
      if (gnext(mp) != 0) {
        gnext(f) += cast_int(mp - f);  /* correct 'next' */
        gnext(mp) = 0;  /* now 'mp' is free */
      }
      setempty(gval(mp));
    }
    else {  /* colliding node is in its own main position */
      /* new node will go into free position */
      if (gnext(mp) != 0)
        gnext(f) = cast_int((mp + gnext(mp)) - f);  /* chain new position */
      else lua_assert(gnext(f) == 0);
      gnext(mp) = cast_int(f - mp);
      mp = f;
    }
  }
  setnodekey(L, mp, key);
  luaC_barrierback(L, obj2gco(t), key);
  lua_assert(isempty(gval(mp)));
  return gval(mp);
}